

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

string * __thiscall
cmCPackIFWGenerator::GetRootPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this)

{
  cmCPackIFWCommon *this_00;
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  cmCPackIFWPackage package;
  string local_318;
  undefined1 local_2f8 [16];
  undefined8 local_2e8;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"root","");
  local_2f8._0_8_ = (cmCPackIFWGenerator *)&stack0xfffffffffffffd18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"CPACK_IFW_PACKAGE_GROUP","");
  this_00 = &this->super_cmCPackIFWCommon;
  pcVar2 = cmCPackIFWCommon::GetOption(this_00,(string *)local_2f8);
  if ((cmCPackIFWGenerator *)local_2f8._0_8_ != (cmCPackIFWGenerator *)&stack0xfffffffffffffd18) {
    operator_delete((void *)local_2f8._0_8_,local_2e8 + 1);
  }
  if (pcVar2 == (char *)0x0) {
    local_2f8._0_8_ = (cmCPackIFWGenerator *)&stack0xfffffffffffffd18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"CPACK_IFW_PACKAGE_NAME","")
    ;
    pcVar2 = cmCPackIFWCommon::GetOption(this_00,(string *)local_2f8);
    if ((cmCPackIFWGenerator *)local_2f8._0_8_ != (cmCPackIFWGenerator *)&stack0xfffffffffffffd18) {
      operator_delete((void *)local_2f8._0_8_,local_2e8 + 1);
    }
    if (pcVar2 == (char *)0x0) {
      local_2f8._0_8_ = (cmCPackIFWGenerator *)&stack0xfffffffffffffd18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"CPACK_PACKAGE_NAME","");
      pcVar2 = cmCPackIFWCommon::GetOption(this_00,(string *)local_2f8);
      if ((cmCPackIFWGenerator *)local_2f8._0_8_ != (cmCPackIFWGenerator *)&stack0xfffffffffffffd18)
      {
        operator_delete((void *)local_2f8._0_8_,local_2e8 + 1);
      }
      if (pcVar2 != (char *)0x0) {
        pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
        strlen(pcVar2);
        std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)pcVar2);
      }
    }
    else {
      pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(pcVar2);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)pcVar2);
    }
  }
  else {
    cmCPackIFWPackage::cmCPackIFWPackage((cmCPackIFWPackage *)local_2f8);
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    local_2f8._0_8_ = this;
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,pcVar2,pcVar2 + sVar3);
    cmCPackIFWPackage::ConfigureFromGroup((cmCPackIFWPackage *)local_2f8,&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    cmCPackIFWPackage::~cmCPackIFWPackage((cmCPackIFWPackage *)local_2f8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetRootPackageName()
{
  // Default value
  std::string name = "root";
  if (const char* optIFW_PACKAGE_GROUP =
        this->GetOption("CPACK_IFW_PACKAGE_GROUP")) {
    // Configure from root group
    cmCPackIFWPackage package;
    package.Generator = this;
    package.ConfigureFromGroup(optIFW_PACKAGE_GROUP);
    name = package.Name;
  } else if (const char* optIFW_PACKAGE_NAME =
               this->GetOption("CPACK_IFW_PACKAGE_NAME")) {
    // Configure from root package name
    name = optIFW_PACKAGE_NAME;
  } else if (const char* optPACKAGE_NAME =
               this->GetOption("CPACK_PACKAGE_NAME")) {
    // Configure from package name
    name = optPACKAGE_NAME;
  }
  return name;
}